

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_options.h
# Opt level: O2

void __thiscall google::protobuf::compiler::csharp::Options::Options(Options *this)

{
  allocator local_12;
  allocator local_11;
  
  std::__cxx11::string::string((string *)this,".cs",&local_11);
  std::__cxx11::string::string((string *)&this->base_namespace,"",&local_12);
  this->base_namespace_specified = false;
  this->internal_access = false;
  return;
}

Assistant:

Options() :
      file_extension(".cs"),
      base_namespace(""),
      base_namespace_specified(false),
      internal_access(false) {
  }